

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportWarning
          (ParserImpl *this,int line,int col,string_view message)

{
  ErrorCollector *pEVar1;
  LogEveryPow2State LVar2;
  char cVar3;
  LogMessage *pLVar4;
  size_t sVar5;
  char *pcVar6;
  LogMessage local_40 [16];
  
  pcVar6 = message._M_str;
  sVar5 = message._M_len;
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[3])(pEVar1,(ulong)(uint)line,(ulong)(uint)col,sVar5,pcVar6);
    return;
  }
  if (line < 0) {
    cVar3 = absl::lts_20240722::log_internal::LogEveryPow2State::ShouldLog();
    LVar2 = ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)::
            absl_log_internal_stateful_condition_state;
    if (cVar3 == '\0') {
      return;
    }
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0x1c2);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (local_40,(char (*) [29])"Warning parsing text-format ");
    pLVar4 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(string *)(this->root_message_type_->all_names_ + 1));
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [7])" (N = ")
    ;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(uint)LVar2.counter_.super___atomic_base<unsigned_int>._M_i);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [4])0x361e0c)
    ;
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,sVar5,pcVar6);
  }
  else {
    cVar3 = absl::lts_20240722::log_internal::LogEveryPow2State::ShouldLog();
    LVar2 = ReportWarning::absl_log_internal_stateful_condition_state;
    if (cVar3 == '\0') {
      return;
    }
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0x1bd);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (local_40,(char (*) [29])"Warning parsing text-format ");
    pLVar4 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(string *)(this->root_message_type_->all_names_ + 1));
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [3])0x3a57c0)
    ;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,line + 1);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [2])0x3b6098)
    ;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,col + 1);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [7])" (N = ")
    ;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar4,(uint)LVar2.counter_.super___atomic_base<unsigned_int>._M_i);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [4])0x361e0c)
    ;
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,sVar5,pcVar6);
  }
  absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_40);
  return;
}

Assistant:

void ReportWarning(int line, int col, const absl::string_view message) {
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << ": " << (line + 1) << ":" << (col + 1) << " (N = " << COUNTER
            << "): " << message;
      } else {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << " (N = " << COUNTER << "): " << message;
      }
    } else {
      error_collector_->RecordWarning(line, col, message);
    }
  }